

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> __thiscall
fmt::v8::detail::
write_int_noinline<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long>
          (detail *this,back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,
          write_int_arg<unsigned_long> arg,basic_format_specs<char8_t> *specs,locale_ref loc)

{
  ulong uVar1;
  presentation_type pVar2;
  size_t sVar3;
  uint uVar4;
  char *digits;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> bVar5;
  long lVar6;
  byte *pbVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  basic_format_specs<char8_t> *specs_00;
  char *pcVar11;
  char *pcVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  format_decimal_result<char8_t_*> fVar17;
  write_int_data<char8_t> data;
  char8_t buffer [20];
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> local_90;
  write_int_data<char8_t> local_88;
  anon_class_40_3_03e05ccd_conflict local_78;
  
  specs_00 = arg._8_8_;
  pVar2 = specs_00->type;
  uVar10 = (uint)arg.abs_value;
  local_90.container = (buffer<char8_t> *)this;
  local_78.write_digits.abs_value = (unsigned_long)out.container;
  switch(pVar2) {
  case none:
  case dec:
    if (((specs_00->field_0xa & 1) != 0) &&
       (bVar16 = write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long,char8_t>
                           (&local_90,(unsigned_long)out.container,uVar10,specs_00,(locale_ref)specs
                           ), bVar16)) {
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)local_90.container;
    }
    bVar5.container = local_90.container;
    lVar14 = 0x3f;
    if (((ulong)out.container | 1) != 0) {
      for (; ((ulong)out.container | 1) >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    iVar13 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar14] -
             (uint)(out.container <
                   *(buffer<char8_t> **)
                    (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                    (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar14] * 8));
    if (specs_00->precision != -1 || specs_00->width != 0) {
      write_int_data<char8_t>::write_int_data(&local_88,iVar13,uVar10,specs_00);
      local_78.data.size = local_88.size;
      local_78.data.padding = local_88.padding;
      local_78.prefix = uVar10;
      local_78.write_digits.num_digits = iVar13;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                        (bVar5,specs_00,local_88.size,local_88.size,
                         (anon_class_40_3_03e05ccd *)&local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar5.container;
    }
    if (-1 < iVar13) {
      if ((uVar10 != 0) &&
         (uVar10 = uVar10 & 0xffffff,
         ((undefined1  [16])arg & (undefined1  [16])0xffffff) != (undefined1  [16])0x0)) {
        do {
          if ((bVar5.container)->capacity_ < (bVar5.container)->size_ + 1) {
            (**(bVar5.container)->_vptr_buffer)(bVar5.container);
          }
          sVar3 = (bVar5.container)->size_;
          (bVar5.container)->size_ = sVar3 + 1;
          (bVar5.container)->ptr_[sVar3] = (char8_t)uVar10;
          bVar16 = 0xff < uVar10;
          uVar10 = uVar10 >> 8;
        } while (bVar16);
      }
      fVar17 = format_decimal<char8_t,unsigned_long>
                         ((char8_t *)&local_78,(unsigned_long)out.container,iVar13);
      bVar5 = copy_str_noinline<char8_t,char8_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                        ((char8_t *)&local_78,fVar17.end,bVar5);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar5.container;
    }
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x195,"negative value");
  case oct:
    bVar5.container = out.container;
    lVar14 = 0;
    do {
      lVar15 = lVar14;
      lVar14 = lVar15 + 1;
      bVar16 = (buffer<char8_t> *)0x7 < bVar5.container;
      bVar5.container = bVar5.container >> 3;
    } while (bVar16);
    iVar13 = (int)lVar14;
    if (((specs_00->field_0x9 & 0x80) != 0) &&
       (out.container != (buffer<char8_t> *)0x0 && specs_00->precision <= iVar13)) {
      uVar9 = 0x3000;
      if (uVar10 == 0) {
        uVar9 = 0x30;
      }
      uVar10 = (uVar9 | uVar10) + 0x1000000;
    }
    if (specs_00->precision != -1 || specs_00->width != 0) {
      write_int_data<char8_t>::write_int_data(&local_88,iVar13,uVar10,specs_00);
      local_78.data.size = local_88.size;
      local_78.data.padding = local_88.padding;
      local_78.prefix = uVar10;
      local_78.write_digits.num_digits = iVar13;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_4_>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_4_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                        ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)this,specs_00,
                         local_88.size,local_88.size,(anon_class_40_3_03e05ccd *)&local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar5.container;
    }
    if ((uVar10 != 0) && (uVar9 = uVar10 & 0xffffff, (uVar10 & 0xffffff) != 0)) {
      do {
        if (*(ulong *)(this + 0x18) < *(long *)(this + 0x10) + 1U) {
          (*(code *)**(undefined8 **)this)(this);
        }
        lVar6 = *(long *)(this + 0x10);
        *(long *)(this + 0x10) = lVar6 + 1;
        *(char *)(*(long *)(this + 8) + lVar6) = (char)uVar9;
        bVar16 = 0xff < uVar9;
        uVar9 = uVar9 >> 8;
      } while (bVar16);
    }
    lVar6 = *(long *)(this + 0x10);
    uVar1 = lVar6 + lVar14;
    if (*(ulong *)(this + 0x18) < uVar1) {
      lVar6 = 0;
    }
    else {
      *(ulong *)(this + 0x10) = uVar1;
      lVar6 = lVar6 + *(long *)(this + 8);
    }
    if (lVar6 != 0) {
      pbVar7 = (byte *)(lVar6 + lVar14);
      do {
        pbVar7 = pbVar7 + -1;
        *pbVar7 = (byte)out.container & 7 | 0x30;
        bVar16 = (buffer<char8_t> *)0x7 < out.container;
        out.container = out.container >> 3;
      } while (bVar16);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)(buffer<char8_t> *)this;
    }
    pbVar7 = (byte *)((long)&local_78.prefix + lVar15);
    pcVar8 = (char *)((long)&local_78.prefix + lVar15 + 1);
    do {
      *pbVar7 = (byte)out.container & 7 | 0x30;
      pbVar7 = pbVar7 + -1;
      bVar16 = (buffer<char8_t> *)0x7 < out.container;
      out.container = out.container >> 3;
    } while (bVar16);
    break;
  case hex_lower:
  case hex_upper:
    if ((specs_00->field_0x9 & 0x80) != 0) {
      uVar4 = (uint)(pVar2 != hex_upper) << 0xd | 0x5830;
      uVar9 = uVar4 << 8;
      if (uVar10 == 0) {
        uVar9 = uVar4;
      }
      uVar10 = (uVar9 | uVar10) + 0x2000000;
    }
    bVar5.container = out.container;
    lVar14 = 0;
    do {
      lVar15 = lVar14;
      lVar14 = lVar15 + 1;
      bVar16 = (buffer<char8_t> *)0xf < bVar5.container;
      bVar5.container = bVar5.container >> 4;
    } while (bVar16);
    if (specs_00->precision != -1 || specs_00->width != 0) {
      lVar15 = ((ulong)(pVar2 == hex_upper) << 0x20) + lVar14;
      write_int_data<char8_t>::write_int_data(&local_88,(int)lVar14,uVar10,specs_00);
      local_78.data.size = local_88.size;
      local_78.data.padding = local_88.padding;
      local_78.write_digits.num_digits = (int)lVar15;
      local_78.write_digits.upper = SUB81((ulong)lVar15 >> 0x20,0);
      local_78.prefix = uVar10;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_2_>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_2_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                        ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)this,specs_00,
                         local_88.size,local_88.size,&local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar5.container;
    }
    if ((uVar10 != 0) && (uVar9 = uVar10 & 0xffffff, (uVar10 & 0xffffff) != 0)) {
      do {
        if (*(ulong *)(this + 0x18) < *(long *)(this + 0x10) + 1U) {
          (*(code *)**(undefined8 **)this)(this);
        }
        lVar6 = *(long *)(this + 0x10);
        *(long *)(this + 0x10) = lVar6 + 1;
        *(char *)(*(long *)(this + 8) + lVar6) = (char)uVar9;
        bVar16 = 0xff < uVar9;
        uVar9 = uVar9 >> 8;
      } while (bVar16);
    }
    lVar6 = *(long *)(this + 0x10);
    uVar1 = lVar6 + lVar14;
    if (*(ulong *)(this + 0x18) < uVar1) {
      lVar6 = 0;
    }
    else {
      *(ulong *)(this + 0x10) = uVar1;
      lVar6 = lVar6 + *(long *)(this + 8);
    }
    if (lVar6 != 0) {
      pcVar8 = "0123456789abcdef";
      if (pVar2 == hex_upper) {
        pcVar8 = "0123456789ABCDEF";
      }
      pcVar11 = (char *)(lVar6 + lVar14);
      do {
        pcVar11 = pcVar11 + -1;
        *pcVar11 = pcVar8[(uint)out.container & 0xf];
        bVar16 = (buffer<char8_t> *)0xf < out.container;
        out.container = out.container >> 4;
      } while (bVar16);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)(buffer<char8_t> *)this;
    }
    pcVar11 = (char *)((long)&local_78.prefix + lVar15);
    pcVar8 = (char *)((long)&local_78.prefix + lVar15 + 1);
    pcVar12 = "0123456789abcdef";
    if (pVar2 == hex_upper) {
      pcVar12 = "0123456789ABCDEF";
    }
    do {
      *pcVar11 = pcVar12[(uint)out.container & 0xf];
      pcVar11 = pcVar11 + -1;
      bVar16 = (buffer<char8_t> *)0xf < out.container;
      out.container = out.container >> 4;
    } while (bVar16);
    break;
  case bin_lower:
  case bin_upper:
    if ((specs_00->field_0x9 & 0x80) != 0) {
      uVar4 = (uint)(pVar2 != bin_upper) << 0xd | 0x4230;
      uVar9 = uVar4 << 8;
      if (uVar10 == 0) {
        uVar9 = uVar4;
      }
      uVar10 = (uVar9 | uVar10) + 0x2000000;
    }
    bVar5.container = out.container;
    lVar14 = 0;
    do {
      lVar15 = lVar14;
      lVar14 = lVar15 + 1;
      bVar16 = (buffer<char8_t> *)0x1 < bVar5.container;
      bVar5.container = bVar5.container >> 1;
    } while (bVar16);
    if (specs_00->precision != -1 || specs_00->width != 0) {
      write_int_data<char8_t>::write_int_data(&local_88,(int)lVar14,uVar10,specs_00);
      local_78.data.size = local_88.size;
      local_78.data.padding = local_88.padding;
      local_78.prefix = uVar10;
      local_78.write_digits.num_digits = (int)lVar14;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_3_>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_3_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                        ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)this,specs_00,
                         local_88.size,local_88.size,(anon_class_40_3_03e05ccd *)&local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar5.container;
    }
    if ((uVar10 != 0) && (uVar9 = uVar10 & 0xffffff, (uVar10 & 0xffffff) != 0)) {
      do {
        if (*(ulong *)(this + 0x18) < *(long *)(this + 0x10) + 1U) {
          (*(code *)**(undefined8 **)this)(this);
        }
        lVar6 = *(long *)(this + 0x10);
        *(long *)(this + 0x10) = lVar6 + 1;
        *(char *)(*(long *)(this + 8) + lVar6) = (char)uVar9;
        bVar16 = 0xff < uVar9;
        uVar9 = uVar9 >> 8;
      } while (bVar16);
    }
    lVar6 = *(long *)(this + 0x10);
    uVar1 = lVar6 + lVar14;
    if (*(ulong *)(this + 0x18) < uVar1) {
      lVar6 = 0;
    }
    else {
      *(ulong *)(this + 0x10) = uVar1;
      lVar6 = lVar6 + *(long *)(this + 8);
    }
    if (lVar6 != 0) {
      pbVar7 = (byte *)(lVar6 + lVar14);
      do {
        pbVar7 = pbVar7 + -1;
        *pbVar7 = (byte)out.container & 1 | 0x30;
        bVar16 = (buffer<char8_t> *)0x1 < out.container;
        out.container = out.container >> 1;
      } while (bVar16);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)(buffer<char8_t> *)this;
    }
    pbVar7 = (byte *)((long)&local_78.prefix + lVar15);
    pcVar8 = (char *)((long)&local_78.prefix + lVar15 + 1);
    do {
      *pbVar7 = (byte)out.container & 1 | 0x30;
      pbVar7 = pbVar7 + -1;
      bVar16 = (buffer<char8_t> *)0x1 < out.container;
      out.container = out.container >> 1;
    } while (bVar16);
    break;
  default:
    fmt::v8::detail::throw_format_error("invalid type specifier");
  case chr:
    local_78.prefix = CONCAT31(local_78.prefix._1_3_,(char)out.container);
    bVar5 = write_padded<(fmt::v8::align::type)1,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_char<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::basic_format_specs<char8_t>const&)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                      ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)this,specs_00,1,1,
                       (anon_class_1_1_a8c68091 *)&local_78);
    return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar5.container;
  }
  bVar5 = copy_str_noinline<char8_t,char*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                    ((char *)&local_78,pcVar8,
                     (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)this);
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar5.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}